

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O2

int XLearnPredictForMat(XL *out,char *model_path,uint64 *length,float **out_arr)

{
  Solver *this;
  HyperParam *hyper_param;
  pointer pfVar1;
  int iVar2;
  float fVar3;
  allocator local_51;
  string local_50;
  Timer timer;
  
  Timer::Timer(&timer);
  Timer::tic(&timer);
  hyper_param = (HyperParam *)*out;
  std::__cxx11::string::string((string *)&local_50,model_path,&local_51);
  std::__cxx11::string::operator=((string *)&hyper_param->model_file,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this = (Solver *)(hyper_param + 1);
  hyper_param->res_out = false;
  hyper_param->is_train = false;
  xLearn::Solver::Initialize(this,hyper_param);
  (this->hyper_param_).is_train = false;
  xLearn::Solver::StartWork(this);
  if (XLearnPredictForMat::tmp_preds == '\0') {
    iVar2 = __cxa_guard_acquire(&XLearnPredictForMat::tmp_preds);
    if (iVar2 != 0) {
      XLearnPredictForMat::tmp_preds.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      XLearnPredictForMat::tmp_preds.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      XLearnPredictForMat::tmp_preds.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      __cxa_atexit(std::vector<float,_std::allocator<float>_>::~vector,
                   &XLearnPredictForMat::tmp_preds,&__dso_handle);
      __cxa_guard_release(&XLearnPredictForMat::tmp_preds);
    }
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_50,
             (vector<float,_std::allocator<float>_> *)&hyper_param[2].opt_type.field_2);
  std::vector<float,_std::allocator<float>_>::_M_move_assign
            (&XLearnPredictForMat::tmp_preds,&local_50);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_50);
  pfVar1 = XLearnPredictForMat::tmp_preds.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  *out_arr = XLearnPredictForMat::tmp_preds.super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_start;
  *length = (long)XLearnPredictForMat::tmp_preds.super__Vector_base<float,_std::allocator<float>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pfVar1 >> 2;
  xLearn::Solver::Clear(this);
  fVar3 = Timer::toc(&timer);
  StringPrintf_abi_cxx11_(&local_50,"Total time cost: %.2f (sec)",(double)fVar3);
  Color::print_info(&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  return 0;
}

Assistant:

XL_DLL int XLearnPredictForMat(XL *out, const char *model_path, 
                               uint64 *length,
                               const float** out_arr) {
  API_BEGIN();
  Timer timer;
  timer.tic();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  xl->GetHyperParam().model_file = std::string(model_path);
  xl->GetHyperParam().res_out = false;
  xl->GetHyperParam().is_train = false;
  xl->GetSolver().Initialize(xl->GetHyperParam());
  xl->GetSolver().SetPredict();
  xl->GetSolver().StartWork();
  static std::vector<real_t> tmp_preds;
  tmp_preds = xl->GetSolver().GetResult();
  std::vector<real_t> &preds = tmp_preds;
  *out_arr = &preds[0];
  *length = static_cast<uint64>(preds.size());
  xl->GetSolver().Clear();
  Color::print_info(
    StringPrintf("Total time cost: %.2f (sec)", 
    timer.toc()), true);
  API_END();
}